

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::default_cost_type<float>::make_l1_norm(default_cost_type<float> *this,int n)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  float fVar3;
  int i;
  ulong uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  
  if (n == 0) {
    fVar5 = 0.0;
  }
  else {
    fVar5 = 0.0;
    uVar4 = 0;
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    do {
      auVar2 = vandps_avx(ZEXT416((uint)(this->linear_elements)._M_t.
                                        super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                        .super__Head_base<0UL,_float_*,_false>._M_head_impl[uVar4]),
                          auVar6);
      fVar5 = fVar5 + auVar2._0_4_;
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  fVar3 = ABS(fVar5);
  if ((n != 0 && (uint)fVar3 < 0x7f800001) &&
      (0x7ffffe < (int)fVar3 - 1U && (fVar3 != INFINITY && fVar5 != 0.0))) {
    pfVar1 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    uVar4 = 0;
    do {
      pfVar1[uVar4] = pfVar1[uVar4] / fVar5;
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }